

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Module::addFunction(Module *this,Function *fun)

{
  Function *local_8;
  
  local_8 = fun;
  std::vector<spv::Function_*,_dxil_spv::ThreadLocalAllocator<spv::Function_*>_>::push_back
            (&this->functions,&local_8);
  return;
}

Assistant:

void addFunction(Function *fun) { functions.push_back(fun); }